

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void Internal_GrowNgon(ON_MeshTopology *top,uchar *emarks,uchar *fmarks,uchar etest_mask,
                      uchar etest_result,uchar ftest_mask,uchar ftest_result,uchar merged_mark,
                      ON_SimpleArray<unsigned_int> *ngon_fi)

{
  ON_MeshTopologyFace *pOVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ON_MeshTopologyEdge *pOVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined7 in_stack_00000011;
  uint local_4c;
  uchar *local_48;
  long local_40;
  long local_38;
  
  lVar11 = CONCAT71(in_stack_00000011,merged_mark);
  if (0 < *(int *)(lVar11 + 0x10)) {
    iVar3 = (top->m_topf).m_count;
    if (0 < *(int *)(lVar11 + 0x10)) {
      lVar9 = 0;
      do {
        fmarks[*(uint *)(*(long *)(lVar11 + 8) + lVar9 * 4)] =
             fmarks[*(uint *)(*(long *)(lVar11 + 8) + lVar9 * 4)] | 0x80;
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)(lVar11 + 0x10));
    }
    if (0 < *(int *)(lVar11 + 0x10)) {
      local_40 = 0;
      local_48 = fmarks;
      do {
        local_38 = (long)*(int *)(*(long *)(lVar11 + 8) + local_40 * 4);
        pOVar1 = (top->m_topf).m_a + local_38;
        iVar4 = pOVar1->m_topei[2];
        iVar2 = pOVar1->m_topei[3];
        iVar5 = pOVar1->m_topei[1];
        iVar6 = pOVar1->m_topei[0];
        lVar9 = 0;
        do {
          lVar10 = (long)pOVar1->m_topei[lVar9];
          if (((-1 < lVar10) && (pOVar1->m_topei[lVar9] <= (top->m_tope).m_count)) &&
             ((emarks[lVar10] & (etest_mask | 0x80)) == etest_result)) {
            emarks[lVar10] = emarks[lVar10] | 0x80;
            pOVar7 = (top->m_tope).m_a;
            if ((pOVar7[lVar10].m_topf_count == 2) &&
               (piVar8 = pOVar7[lVar10].m_topfi, piVar8 != (int *)0x0)) {
              local_4c = piVar8[(int)local_38 == *piVar8];
              lVar10 = (long)(int)local_4c;
              if ((-1 < lVar10) &&
                 (((int)local_4c < iVar3 && ((fmarks[lVar10] & (ftest_mask | 0x80)) == ftest_result)
                  ))) {
                fmarks[lVar10] = fmarks[lVar10] | 0x80;
                ON_SimpleArray<unsigned_int>::Append
                          ((ON_SimpleArray<unsigned_int> *)CONCAT71(in_stack_00000011,merged_mark),
                           &local_4c);
                lVar11 = CONCAT71(in_stack_00000011,merged_mark);
                fmarks = local_48;
              }
            }
          }
          lVar9 = lVar9 + 1;
        } while (4 - (ulong)(iVar6 != iVar5 && iVar4 == iVar2) != lVar9);
        local_40 = local_40 + 1;
      } while (local_40 < *(int *)(lVar11 + 0x10));
    }
  }
  return;
}

Assistant:

static void Internal_GrowNgon(
  const ON_MeshTopology& top,
  unsigned char* emarks,
  unsigned char* fmarks,
  unsigned char etest_mask,
  unsigned char etest_result,
  unsigned char ftest_mask,
  unsigned char ftest_result,
  const unsigned char merged_mark,
  ON_SimpleArray<unsigned>& ngon_fi
)
{
  if (ngon_fi.Count() <= 0)
    return;

  const int face_count = top.m_topf.Count();

  for (int nfi = 0; nfi < ngon_fi.Count(); ++nfi)
    fmarks[ngon_fi[nfi]] |= merged_mark;

  etest_mask |= merged_mark;
  etest_result &= ~merged_mark;

  ftest_mask |= merged_mark;
  ftest_result &= ~merged_mark;

  for (int nfi = 0; nfi < ngon_fi.Count(); ++nfi)
  {
    const int f0i = ngon_fi[nfi];
    const ON_MeshTopologyFace& f0 = top.m_topf[f0i];
    const int f0_ecount = f0.IsTriangle() ? 3 : 4;
    for (int fei = 0; fei < f0_ecount; ++fei)
    {
      const int ei = f0.m_topei[fei];
      if (ei < 0 || ei > top.m_tope.Count())
        continue;
      if (etest_result != (emarks[ei] & etest_mask))
        continue;
      emarks[ei] |= merged_mark;
      const ON_MeshTopologyEdge& e = top.m_tope[ei];
      if (2 != e.m_topf_count || nullptr == e.m_topfi)
        continue;
      const int efi = (f0i != e.m_topfi[0]) ? 0 : 1;
      const int f1i = e.m_topfi[efi];
      if (f1i < 0 || f1i >= face_count)
        continue;
      if (ftest_result != (fmarks[f1i] & ftest_mask))
        continue;
      fmarks[f1i] |= merged_mark;
      ngon_fi.Append(f1i);
    }
  }
}